

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::create_look_ups(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = 0x2c8d00;
  iVar2 = 0x5b6900;
  iVar3 = -0xe25100;
  iVar4 = -0xb2f480;
  lVar5 = -0x100;
  do {
    this->m_cbb[lVar5] = iVar4 >> 0x10;
    this->m_crg[lVar5] = iVar3 >> 0x10;
    this->m_cbg[lVar5] = iVar2;
    *(int *)((long)&this->m_pScan_line_0 + lVar5 * 4) = iVar1;
    iVar1 = iVar1 + -0x581a;
    iVar2 = iVar2 + -0xb6d2;
    iVar3 = iVar3 + 0x1c5a2;
    iVar4 = iVar4 + 0x166e9;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void jpeg_decoder::create_look_ups()
	{
		for (int i = 0; i <= 255; i++)
		{
			int k = i - 128;
			m_crr[i] = (FIX(1.40200f) * k + ONE_HALF) >> SCALEBITS;
			m_cbb[i] = (FIX(1.77200f) * k + ONE_HALF) >> SCALEBITS;
			m_crg[i] = (-FIX(0.71414f)) * k;
			m_cbg[i] = (-FIX(0.34414f)) * k + ONE_HALF;
		}
	}